

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_unhash.cpp
# Opt level: O2

void ritobin::BinUnhasherVisit::value(BinUnhasher *unhasher,Embed *value,int max_depth)

{
  pointer pFVar1;
  Field *item;
  pointer value_00;
  
  BinUnhasher::unhash_hash(unhasher,&value->name);
  pFVar1 = (value->items).super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (value_00 = (value->items).super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>
                  ._M_impl.super__Vector_impl_data._M_start; value_00 != pFVar1;
      value_00 = value_00 + 1) {
    BinUnhasher::unhash_hash(unhasher,&value_00->key);
    BinUnhasher::unhash_value(unhasher,&value_00->value,max_depth);
  }
  return;
}

Assistant:

static void value(BinUnhasher const& unhasher, Embed& value, int max_depth) noexcept {
            unhasher.unhash_hash(value.name);
            for (auto& item : value.items) {
                unhasher.unhash_hash(item.key);
                unhasher.unhash_value(item.value, max_depth);
            }
        }